

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binjgb.c
# Opt level: O2

void usage(int argc,char **argv)

{
  undefined4 in_register_0000003c;
  
  fprintf(_stderr,
          "usage: %s [options] <in.gb>\n  -h,--help               help\n  -j,--read-joypad FILE   read joypad input from FILE\n  -J,--write-joypad FILE  write joypad input to FILE\n  -s,--seed SEED          random seed used for initializing RAM\n  -P,--palette PAL        use a builtin palette for DMG\n  -x,--scale SCALE        render scale\n  -C,--cgb-color COLOR    cgb color curve to use\n                            0: none\n                            1: Sameboy (Emulate Hardware)\n                            2: Gambatte/Gameboy Online\n     --force-dmg          force running as a DMG (original gameboy)\n     --sgb-border         draw the super gameboy border\n"
          ,*(undefined8 *)CONCAT44(in_register_0000003c,argc));
  return;
}

Assistant:

static void usage(int argc, char** argv) {
  PRINT_ERROR(
      "usage: %s [options] <in.gb>\n"
      "  -h,--help               help\n"
      "  -j,--read-joypad FILE   read joypad input from FILE\n"
      "  -J,--write-joypad FILE  write joypad input to FILE\n"
      "  -s,--seed SEED          random seed used for initializing RAM\n"
      "  -P,--palette PAL        use a builtin palette for DMG\n"
      "  -x,--scale SCALE        render scale\n"
      "  -C,--cgb-color COLOR    cgb color curve to use\n"
      "                            0: none\n"
      "                            1: Sameboy (Emulate Hardware)\n"
      "                            2: Gambatte/Gameboy Online\n"
      "     --force-dmg          force running as a DMG (original gameboy)\n"
      "     --sgb-border         draw the super gameboy border\n",
      argv[0]);
}